

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_3650dd::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char *pcVar1;
  char *this;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmMakefile *this_00;
  char *local_1b8;
  string_view local_150;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  char *local_c8;
  char *result;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_60;
  uint local_40;
  int local_3c;
  uint i;
  Doing doing;
  char *var;
  char *file_rhs;
  char *file_lhs;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  file_rhs = (char *)0x0;
  var = (char *)0x0;
  _i = (char *)0x0;
  local_3c = 1;
  local_40 = 1;
  file_lhs = (char *)status;
  status_local = (cmExecutionStatus *)args;
  do {
    uVar3 = (ulong)local_40;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    this = file_lhs;
    pcVar1 = file_rhs;
    if (sVar4 <= uVar3) {
      if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"DIFFERENT not given result variable name.",&local_91);
        cmExecutionStatus::SetError((cmExecutionStatus *)this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        args_local._7_1_ = false;
      }
      else if ((file_rhs == (char *)0x0) || (var == (char *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)((long)&result + 7));
        cmExecutionStatus::SetError((cmExecutionStatus *)this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
        args_local._7_1_ = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
        pcVar1 = var;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar1,&local_111);
        bVar2 = cmsys::SystemTools::FilesDiffer(&local_e8,&local_110);
        if (bVar2) {
          local_1b8 = "1";
        }
        else {
          local_1b8 = "0";
        }
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        local_c8 = local_1b8;
        this_00 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)file_lhs);
        pcVar1 = _i;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar1,&local_139);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_150,local_c8);
        cmMakefile::AddDefinition(this_00,&local_138,local_150);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        args_local._7_1_ = true;
      }
      return args_local._7_1_;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(ulong)local_40);
    bVar2 = std::operator==(pvVar5,"FILES");
    pcVar1 = file_lhs;
    if (bVar2) {
      local_3c = 2;
    }
    else if (local_3c == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      _i = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    else if (local_3c == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      file_rhs = (char *)std::__cxx11::string::c_str();
      local_3c = 3;
    }
    else {
      if (local_3c != 3) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_40);
        cmStrCat<char_const(&)[34],std::__cxx11::string_const&>
                  (&local_60,(char (*) [34])"DIFFERENT given unknown argument ",pvVar5);
        cmExecutionStatus::SetError((cmExecutionStatus *)pcVar1,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        return false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,(ulong)local_40);
      var = (char *)std::__cxx11::string::c_str();
      local_3c = 0;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}